

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_127a7::TestCheckEqualsWithStringsFailsOnDifferentStrings::RunImpl
          (TestCheckEqualsWithStringsFailsOnDifferentStrings *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int local_70 [2];
  char txt2 [6];
  char txt1 [6];
  TestDetails local_58;
  TestResults results;
  
  builtin_strncpy(txt1,"Hello",6);
  builtin_strncpy(txt2,"Hallo",6);
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckEqual(&results,txt1,txt2,&local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_70[1] = 1;
  local_70[0] = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_58,*ppTVar2,0x17);
  UnitTest::CheckEqual<int,int>(results_00,local_70 + 1,local_70,&local_58);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}